

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_secrets.cpp
# Opt level: O1

unique_ptr<duckdb::BaseSecret,_std::default_delete<duckdb::BaseSecret>,_true> __thiscall
duckdb::CreateHTTPSecretFunctions::CreateHTTPSecretFromEnv
          (CreateHTTPSecretFunctions *this,ClientContext *context,CreateSecretInput *input)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> **pp_Var1;
  KeyValueSecret *this_00;
  char *pcVar2;
  pointer pKVar3;
  mapped_type *pmVar4;
  pointer *__ptr;
  templated_unique_single_t secret;
  _Head_base<0UL,_duckdb::KeyValueSecret_*,_false> local_98;
  Value local_90;
  key_type local_50;
  
  this_00 = (KeyValueSecret *)operator_new(0xf0);
  KeyValueSecret::KeyValueSecret(this_00,&input->scope,&input->type,&input->provider,&input->name);
  local_98._M_head_impl = this_00;
  pcVar2 = TryGetEnv("http_proxy");
  if (pcVar2 != (char *)0x0) {
    Value::Value(&local_90,pcVar2);
    pKVar3 = unique_ptr<duckdb::KeyValueSecret,_std::default_delete<duckdb::KeyValueSecret>,_true>::
             operator->((unique_ptr<duckdb::KeyValueSecret,_std::default_delete<duckdb::KeyValueSecret>,_true>
                         *)&local_98);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"http_proxy","");
    pmVar4 = ::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value,_duckdb::CaseInsensitiveStringCompare,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
             ::operator[](&pKVar3->secret_map,&local_50);
    Value::operator=(pmVar4,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    Value::~Value(&local_90);
  }
  pcVar2 = TryGetEnv("http_proxy_password");
  if (pcVar2 != (char *)0x0) {
    Value::Value(&local_90,pcVar2);
    pKVar3 = unique_ptr<duckdb::KeyValueSecret,_std::default_delete<duckdb::KeyValueSecret>,_true>::
             operator->((unique_ptr<duckdb::KeyValueSecret,_std::default_delete<duckdb::KeyValueSecret>,_true>
                         *)&local_98);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"http_proxy_password","");
    pmVar4 = ::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value,_duckdb::CaseInsensitiveStringCompare,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
             ::operator[](&pKVar3->secret_map,&local_50);
    Value::operator=(pmVar4,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    Value::~Value(&local_90);
  }
  pcVar2 = TryGetEnv("http_proxy_username");
  if (pcVar2 != (char *)0x0) {
    Value::Value(&local_90,pcVar2);
    pKVar3 = unique_ptr<duckdb::KeyValueSecret,_std::default_delete<duckdb::KeyValueSecret>,_true>::
             operator->((unique_ptr<duckdb::KeyValueSecret,_std::default_delete<duckdb::KeyValueSecret>,_true>
                         *)&local_98);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"http_proxy_username","");
    pmVar4 = ::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value,_duckdb::CaseInsensitiveStringCompare,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
             ::operator[](&pKVar3->secret_map,&local_50);
    Value::operator=(pmVar4,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    Value::~Value(&local_90);
  }
  pKVar3 = unique_ptr<duckdb::KeyValueSecret,_std::default_delete<duckdb::KeyValueSecret>,_true>::
           operator->((unique_ptr<duckdb::KeyValueSecret,_std::default_delete<duckdb::KeyValueSecret>,_true>
                       *)&local_98);
  pp_Var1 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)((long)&local_90 + 0x10);
  local_90.type_._0_8_ = pp_Var1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"http_proxy","");
  KeyValueSecret::TrySetValue(pKVar3,(string *)&local_90,input);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_90.type_._0_8_ != pp_Var1) {
    operator_delete((void *)local_90.type_._0_8_);
  }
  pKVar3 = unique_ptr<duckdb::KeyValueSecret,_std::default_delete<duckdb::KeyValueSecret>,_true>::
           operator->((unique_ptr<duckdb::KeyValueSecret,_std::default_delete<duckdb::KeyValueSecret>,_true>
                       *)&local_98);
  local_90.type_._0_8_ = pp_Var1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"http_proxy_password","");
  KeyValueSecret::TrySetValue(pKVar3,(string *)&local_90,input);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_90.type_._0_8_ != pp_Var1) {
    operator_delete((void *)local_90.type_._0_8_);
  }
  pKVar3 = unique_ptr<duckdb::KeyValueSecret,_std::default_delete<duckdb::KeyValueSecret>,_true>::
           operator->((unique_ptr<duckdb::KeyValueSecret,_std::default_delete<duckdb::KeyValueSecret>,_true>
                       *)&local_98);
  local_90.type_._0_8_ = pp_Var1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"http_proxy_username","");
  KeyValueSecret::TrySetValue(pKVar3,(string *)&local_90,input);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_90.type_._0_8_ != pp_Var1) {
    operator_delete((void *)local_90.type_._0_8_);
  }
  pKVar3 = unique_ptr<duckdb::KeyValueSecret,_std::default_delete<duckdb::KeyValueSecret>,_true>::
           operator->((unique_ptr<duckdb::KeyValueSecret,_std::default_delete<duckdb::KeyValueSecret>,_true>
                       *)&local_98);
  local_90.type_._0_8_ = pp_Var1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"extra_http_headers","");
  KeyValueSecret::TrySetValue(pKVar3,(string *)&local_90,input);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_90.type_._0_8_ != pp_Var1) {
    operator_delete((void *)local_90.type_._0_8_);
  }
  pKVar3 = unique_ptr<duckdb::KeyValueSecret,_std::default_delete<duckdb::KeyValueSecret>,_true>::
           operator->((unique_ptr<duckdb::KeyValueSecret,_std::default_delete<duckdb::KeyValueSecret>,_true>
                       *)&local_98);
  local_90.type_._0_8_ = pp_Var1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"bearer_token","");
  KeyValueSecret::TrySetValue(pKVar3,(string *)&local_90,input);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_90.type_._0_8_ != pp_Var1) {
    operator_delete((void *)local_90.type_._0_8_);
  }
  *(KeyValueSecret **)this = local_98._M_head_impl;
  return (unique_ptr<duckdb::BaseSecret,_std::default_delete<duckdb::BaseSecret>_>)
         (unique_ptr<duckdb::BaseSecret,_std::default_delete<duckdb::BaseSecret>_>)this;
}

Assistant:

unique_ptr<BaseSecret> CreateHTTPSecretFunctions::CreateHTTPSecretFromEnv(ClientContext &context,
                                                                          CreateSecretInput &input) {
	auto secret = make_uniq<KeyValueSecret>(input.scope, input.type, input.provider, input.name);

	auto http_proxy = TryGetEnv("http_proxy");
	if (http_proxy) {
		secret->secret_map["http_proxy"] = Value(http_proxy);
	}
	auto http_proxy_password = TryGetEnv("http_proxy_password");
	if (http_proxy_password) {
		secret->secret_map["http_proxy_password"] = Value(http_proxy_password);
	}
	auto http_proxy_username = TryGetEnv("http_proxy_username");
	if (http_proxy_username) {
		secret->secret_map["http_proxy_username"] = Value(http_proxy_username);
	}

	// Allow overwrites
	secret->TrySetValue("http_proxy", input);
	secret->TrySetValue("http_proxy_password", input);
	secret->TrySetValue("http_proxy_username", input);

	secret->TrySetValue("extra_http_headers", input);
	secret->TrySetValue("bearer_token", input);

	return std::move(secret);
}